

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BS_thread_pool.hpp
# Opt level: O0

void __thiscall
BS::thread_pool<(unsigned_char)0>::
detach_loop<unsigned_long,unsigned_long,unsigned_long,slang::driver::SourceLoader::loadAndParseSources(slang::Bag_const&)::__3>
          (thread_pool<(unsigned_char)__x00_> *this,unsigned_long first_index,
          unsigned_long index_after_last,anon_class_32_4_775ebe94 *loop,size_t num_blocks,
          priority_t priority)

{
  size_t sVar1;
  thread_pool<(unsigned_char)__x00_> *in_RDX;
  thread_pool<(unsigned_char)__x00_> *in_RSI;
  anon_class_32_4_775ebe94 *in_RDI;
  blocks<unsigned_long> *in_R8;
  size_t blk;
  blocks<unsigned_long> blks;
  shared_ptr<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_driver_SourceLoader_cpp:280:64)>
  loop_ptr;
  blocks<unsigned_long> *in_stack_ffffffffffffff28;
  size_t in_stack_ffffffffffffff38;
  ulong block;
  blocks<unsigned_long> *this_00;
  thread_pool<(unsigned_char)__x00_> *task;
  thread_pool<(unsigned_char)__x00_> *this_01;
  shared_ptr<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_driver_SourceLoader_cpp:280:64)>
  local_90;
  unsigned_long local_80;
  unsigned_long local_78;
  ulong local_70;
  blocks<unsigned_long> local_68;
  blocks<unsigned_long> *local_28;
  thread_pool<(unsigned_char)__x00_> *local_18;
  thread_pool<(unsigned_char)__x00_> *local_10;
  
  if (in_RSI < in_RDX) {
    local_28 = in_R8;
    local_18 = in_RDX;
    local_10 = in_RSI;
    std::
    make_shared<slang::driver::SourceLoader::loadAndParseSources(slang::Bag_const&)::__3,slang::driver::SourceLoader::loadAndParseSources(slang::Bag_const&)::__3>
              (in_RDI);
    this_00 = local_28;
    if (local_28 == (blocks<unsigned_long> *)0x0) {
      this_00 = (blocks<unsigned_long> *)in_RDI[9].unitList;
    }
    blocks<unsigned_long>::blocks
              ((blocks<unsigned_long> *)local_18,(unsigned_long)local_10,(unsigned_long)this_00,
               in_stack_ffffffffffffff38);
    local_70 = 0;
    task = local_10;
    this_01 = local_18;
    while (block = local_70, sVar1 = blocks<unsigned_long>::get_num_blocks(&local_68), block < sVar1
          ) {
      std::
      shared_ptr<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/SourceLoader.cpp:280:64)>
      ::shared_ptr(&local_90,
                   (shared_ptr<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_driver_SourceLoader_cpp:280:64)>
                    *)in_stack_ffffffffffffff28);
      in_stack_ffffffffffffff28 = &local_68;
      local_80 = blocks<unsigned_long>::start(in_stack_ffffffffffffff28,local_70);
      local_78 = blocks<unsigned_long>::end(this_00,block);
      detach_task<BS::thread_pool<(unsigned_char)0>::detach_loop<unsigned_long,unsigned_long,unsigned_long,slang::driver::SourceLoader::loadAndParseSources(slang::Bag_const&)::__3>(unsigned_long,unsigned_long,slang::driver::SourceLoader::loadAndParseSources(slang::Bag_const&)::__3&&,unsigned_long,signed_char)::_lambda()_1_>
                (this_01,(anon_class_32_3_8a730cd2 *)task,(priority_t)((ulong)this_00 >> 0x38));
      detach_loop<unsigned_long,unsigned_long,unsigned_long,slang::driver::SourceLoader::loadAndParseSources(slang::Bag_const&)::$_3>(unsigned_long,unsigned_long,slang::driver::SourceLoader::loadAndParseSources(slang::Bag_const&)::$_3&&,unsigned_long,signed_char)
      ::{lambda()#1}::~detach_loop((anon_class_32_3_8a730cd2 *)0x30f2f2);
      local_70 = local_70 + 1;
    }
    std::
    shared_ptr<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/driver/SourceLoader.cpp:280:64)>
    ::~shared_ptr((shared_ptr<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_driver_SourceLoader_cpp:280:64)>
                   *)0x30f339);
  }
  return;
}

Assistant:

void detach_loop(const T1 first_index, const T2 index_after_last, F&& loop, const std::size_t num_blocks = 0, const priority_t priority = 0)
    {
        if (static_cast<T>(index_after_last) > static_cast<T>(first_index))
        {
            const std::shared_ptr<std::decay_t<F>> loop_ptr = std::make_shared<std::decay_t<F>>(std::forward<F>(loop));
            const blocks blks(static_cast<T>(first_index), static_cast<T>(index_after_last), num_blocks ? num_blocks : thread_count);
            for (std::size_t blk = 0; blk < blks.get_num_blocks(); ++blk)
            {
                detach_task(
                    [loop_ptr, start = blks.start(blk), end = blks.end(blk)]
                    {
                        for (T i = start; i < end; ++i)
                            (*loop_ptr)(i);
                    },
                    priority);
            }
        }
    }